

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::OneMinusTessCoordComponentCase::checkTessCoordComponent
          (OneMinusTessCoordComponentCase *this,float component)

{
  ostringstream *this_00;
  undefined1 local_190 [384];
  
  if ((component != 1.0) || (NAN(component))) {
    local_190._0_8_ =
         ((this->super_TessCoordComponentInvarianceCase).super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,
               "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
               ,0x5a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
  }
  return (bool)(-(component == 1.0) & 1);
}

Assistant:

virtual bool checkTessCoordComponent (float component) const
	{
		if (component != 1.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << TestLog::EndMessage;
			return false;
		}
		return true;
	}